

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

int yaml_parser_scan_version_directive_number
              (yaml_parser_t *parser,yaml_mark_t start_mark,int *number)

{
  bool bVar1;
  int iVar2;
  int local_48;
  int local_44;
  int local_40;
  ulong local_30;
  size_t length;
  int value;
  int *number_local;
  yaml_parser_t *parser_local;
  
  length._4_4_ = 0;
  local_30 = 0;
  if (parser->unread != 0) goto LAB_0023bf1e;
  iVar2 = yaml_parser_update_buffer(parser,1);
  do {
    if (iVar2 == 0) {
      return 0;
    }
LAB_0023bf1e:
    do {
      bVar1 = false;
      if (0x2f < *(parser->buffer).pointer) {
        bVar1 = *(parser->buffer).pointer < 0x3a;
      }
      if (!bVar1) {
        if (local_30 == 0) {
          iVar2 = yaml_parser_set_scanner_error
                            (parser,"while scanning a %YAML directive",start_mark,
                             "did not find expected version number");
          return iVar2;
        }
        *number = length._4_4_;
        return 1;
      }
      local_30 = local_30 + 1;
      if (9 < local_30) {
        iVar2 = yaml_parser_set_scanner_error
                          (parser,"while scanning a %YAML directive",start_mark,
                           "found extremely long version number");
        return iVar2;
      }
      length._4_4_ = length._4_4_ * 10 + (*(parser->buffer).pointer - 0x30);
      (parser->mark).index = (parser->mark).index + 1;
      (parser->mark).column = (parser->mark).column + 1;
      parser->unread = parser->unread - 1;
      if ((*(parser->buffer).pointer & 0x80) == 0) {
        local_40 = 1;
      }
      else {
        if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
          local_44 = 2;
        }
        else {
          if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
            local_48 = 3;
          }
          else {
            local_48 = 0;
            if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
              local_48 = 4;
            }
          }
          local_44 = local_48;
        }
        local_40 = local_44;
      }
      (parser->buffer).pointer = (parser->buffer).pointer + local_40;
    } while (parser->unread != 0);
    iVar2 = yaml_parser_update_buffer(parser,1);
  } while( true );
}

Assistant:

static int
yaml_parser_scan_version_directive_number(yaml_parser_t *parser,
        yaml_mark_t start_mark, int *number)
{
    int value = 0;
    size_t length = 0;

    /* Repeat while the next character is digit. */

    if (!CACHE(parser, 1)) return 0;

    while (IS_DIGIT(parser->buffer))
    {
        /* Check if the number is too long. */

        if (++length > MAX_NUMBER_LENGTH) {
            return yaml_parser_set_scanner_error(parser, "while scanning a %YAML directive",
                    start_mark, "found extremely long version number");
        }

        value = value*10 + AS_DIGIT(parser->buffer);

        SKIP(parser);

        if (!CACHE(parser, 1)) return 0;
    }

    /* Check if the number was present. */

    if (!length) {
        return yaml_parser_set_scanner_error(parser, "while scanning a %YAML directive",
                start_mark, "did not find expected version number");
    }

    *number = value;

    return 1;
}